

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

void __thiscall
Fossilize::ConcurrentDatabase::ConcurrentDatabase
          (ConcurrentDatabase *this,char *base_path_,DatabaseMode mode_,char **extra_paths,
          size_t num_extra_paths)

{
  ulong uVar1;
  char *path;
  DatabaseInterface *__p;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_88;
  char *local_80;
  DatabaseInterface *local_68;
  ulong local_60;
  size_t i;
  string readonly_path;
  size_t num_extra_paths_local;
  char **extra_paths_local;
  DatabaseMode mode__local;
  char *base_path__local;
  ConcurrentDatabase *this_local;
  
  DatabaseInterface::DatabaseInterface(&this->super_DatabaseInterface,mode_);
  (this->super_DatabaseInterface)._vptr_DatabaseInterface =
       (_func_int **)&PTR__ConcurrentDatabase_00207bb8;
  local_80 = base_path_;
  if (base_path_ == (char *)0x0) {
    local_80 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&this->base_path,local_80,
             (allocator *)(readonly_path.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(readonly_path.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)&this->bucket_dirname);
  std::__cxx11::string::string((string *)&this->bucket_basename);
  this->mode = mode_;
  std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>::
  unique_ptr<std::default_delete<Fossilize::DatabaseInterface>,void>
            ((unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>
              *)&this->readonly_interface);
  std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>::
  unique_ptr<std::default_delete<Fossilize::DatabaseInterface>,void>
            ((unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>
              *)&this->writeonly_interface);
  std::
  vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
  ::vector(&this->extra_readonly);
  local_88 = this->primed_hashes;
  do {
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::unordered_set(local_88);
    local_88 = local_88 + 1;
  } while (local_88 !=
           (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            *)&this->has_prepared_readonly);
  this->has_prepared_readonly = false;
  this->need_writeonly_database = true;
  if (this->mode == ExclusiveOverWrite) {
    this->mode = OverWrite;
  }
  if (this->mode != OverWrite) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                     &this->base_path,".foz");
      path = (char *)std::__cxx11::string::c_str();
      __p = create_stream_archive_database(path,ReadOnly);
      std::
      unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>::
      reset(&this->readonly_interface,__p);
      std::__cxx11::string::~string((string *)&i);
    }
    for (local_60 = 0; local_60 < num_extra_paths; local_60 = local_60 + 1) {
      local_68 = create_stream_archive_database(extra_paths[local_60],ReadOnly);
      std::
      vector<std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>,std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>>>
      ::emplace_back<Fossilize::DatabaseInterface*>
                ((vector<std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>,std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>>>
                  *)&this->extra_readonly,&local_68);
    }
  }
  return;
}

Assistant:

explicit ConcurrentDatabase(const char *base_path_, DatabaseMode mode_,
	                            const char * const *extra_paths, size_t num_extra_paths)
		: DatabaseInterface(mode_), base_path(base_path_ ? base_path_ : ""), mode(mode_)
	{
		// Normalize this mode. The concurrent database is always "exclusive write".
		if (mode == DatabaseMode::ExclusiveOverWrite)
			mode = DatabaseMode::OverWrite;

		if (mode != DatabaseMode::OverWrite)
		{
			if (!base_path.empty())
			{
				std::string readonly_path = base_path + ".foz";
				readonly_interface.reset(create_stream_archive_database(readonly_path.c_str(), DatabaseMode::ReadOnly));
			}

			for (size_t i = 0; i < num_extra_paths; i++)
				extra_readonly.emplace_back(create_stream_archive_database(extra_paths[i], DatabaseMode::ReadOnly));
		}
	}